

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O0

void Vec_IntIsOrdered(Vec_Int_t *vCut)

{
  int iVar1;
  int local_18;
  int Entry;
  int Prev;
  int i;
  Vec_Int_t *vCut_local;
  
  local_18 = Vec_IntEntry(vCut,0);
  Entry = 1;
  while( true ) {
    iVar1 = Vec_IntSize(vCut);
    if (iVar1 <= Entry) {
      return;
    }
    iVar1 = Vec_IntEntry(vCut,Entry);
    if (iVar1 <= local_18) break;
    Entry = Entry + 1;
    local_18 = iVar1;
  }
  __assert_fail("Prev < Entry",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                ,0xca,"void Vec_IntIsOrdered(Vec_Int_t *)");
}

Assistant:

void Vec_IntIsOrdered( Vec_Int_t * vCut )
{
    int i, Prev, Entry;
    Prev = Vec_IntEntry( vCut, 0 );
    Vec_IntForEachEntryStart( vCut, Entry, i, 1 )
    {
        assert( Prev < Entry );
        Prev = Entry;
    }
}